

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_mask_util.cc
# Opt level: O1

bool __thiscall
google::protobuf::util::anon_unknown_0::FieldMaskTree::TrimMessage
          (FieldMaskTree *this,Node *node,Message *message)

{
  FieldDescriptor *field;
  long lVar1;
  once_flag *__once;
  FieldMaskTree *this_00;
  Reflection *pRVar2;
  uint uVar3;
  bool bVar4;
  byte bVar5;
  int iVar6;
  LogMessage *other;
  const_iterator cVar7;
  Node *node_00;
  Reflection *extraout_RDX;
  Message *message_00;
  long lVar8;
  LogMessage local_a8;
  FieldDescriptor *local_70;
  long local_68;
  _Base_ptr local_60;
  long local_58;
  _func_void_FieldDescriptor_ptr *local_50;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node_*>_>_>
  *local_48;
  Reflection *local_40;
  uint local_34;
  
  local_48 = (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node_*>_>_>
              *)this;
  if ((this->root_).children._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
    protobuf::internal::LogMessage::LogMessage
              (&local_a8,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O1/src/src/google/protobuf/util/field_mask_util.cc"
               ,0x24d);
    other = protobuf::internal::LogMessage::operator<<
                      (&local_a8,"CHECK failed: !node->children.empty(): ");
    protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_50,other);
    protobuf::internal::LogMessage::~LogMessage(&local_a8);
  }
  (**(code **)(*(long *)&(node->children)._M_t._M_impl + 0x98))(node);
  local_68 = (**(code **)(*(long *)&(node->children)._M_t._M_impl + 0x98))(node);
  if ((long)*(int *)(local_68 + 0x68) < 1) {
    bVar5 = 0;
  }
  else {
    local_60 = &(((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node_*>_>_>
                   *)&(local_48->_M_t)._M_impl)->_M_t)._M_impl.super__Rb_tree_header._M_header;
    local_58 = (long)*(int *)(local_68 + 0x68) * 0x98;
    lVar8 = 0;
    local_34 = 0;
    local_40 = extraout_RDX;
    do {
      lVar1 = *(long *)(local_68 + 0x28);
      field = (FieldDescriptor *)(lVar1 + lVar8);
      cVar7 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node_*>_>_>
              ::find(local_48,*(key_type **)(lVar1 + lVar8));
      pRVar2 = local_40;
      if (cVar7._M_node == local_60) {
        if (*(int *)(lVar1 + 0x3c + lVar8) == 3) {
          iVar6 = Reflection::FieldSize(local_40,(Message *)node,field);
          local_34 = local_34 & 0xff;
          if (iVar6 != 0) {
            local_34 = 1;
          }
        }
        else {
          bVar4 = Reflection::HasField(local_40,(Message *)node,field);
          local_34 = local_34 & 0xff;
          if (bVar4) {
            local_34 = 1;
          }
        }
        Reflection::ClearField(pRVar2,(Message *)node,field);
        uVar3 = local_34;
      }
      else {
        __once = *(once_flag **)(lVar1 + 0x30 + lVar8);
        if (__once != (once_flag *)0x0) {
          local_50 = FieldDescriptor::TypeOnceInit;
          local_70 = field;
          std::
          call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                    (__once,&local_50,&local_70);
        }
        pRVar2 = local_40;
        uVar3 = local_34;
        if (((*(int *)(FieldDescriptor::kTypeToCppTypeMap +
                      (ulong)*(uint *)(lVar1 + 0x38 + lVar8) * 4) == 10) &&
            (this_00 = *(FieldMaskTree **)(cVar7._M_node + 2),
            (this_00->root_).children._M_t._M_impl.super__Rb_tree_header._M_node_count != 0)) &&
           (bVar4 = Reflection::HasField(local_40,(Message *)node,field), uVar3 = local_34, bVar4))
        {
          node_00 = (Node *)Reflection::MutableMessage
                                      (pRVar2,(Message *)node,field,(MessageFactory *)0x0);
          bVar4 = TrimMessage(this_00,node_00,message_00);
          uVar3 = 1;
          if (!bVar4) {
            uVar3 = local_34 & 0xff;
          }
        }
      }
      local_34 = uVar3;
      lVar8 = lVar8 + 0x98;
    } while (local_58 != lVar8);
    bVar5 = (byte)local_34;
  }
  return (bool)(bVar5 & 1);
}

Assistant:

bool FieldMaskTree::TrimMessage(const Node* node, Message* message) {
  GOOGLE_DCHECK(!node->children.empty());
  const Reflection* reflection = message->GetReflection();
  const Descriptor* descriptor = message->GetDescriptor();
  const int32 field_count = descriptor->field_count();
  bool modified = false;
  for (int index = 0; index < field_count; ++index) {
    const FieldDescriptor* field = descriptor->field(index);
    std::map<std::string, Node*>::const_iterator it =
        node->children.find(field->name());
    if (it == node->children.end()) {
      if (field->is_repeated()) {
        if (reflection->FieldSize(*message, field) != 0) {
          modified = true;
        }
      } else {
        if (reflection->HasField(*message, field)) {
          modified = true;
        }
      }
      reflection->ClearField(message, field);
    } else {
      if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
        Node* child = it->second;
        if (!child->children.empty() && reflection->HasField(*message, field)) {
          bool nestedMessageChanged =
              TrimMessage(child, reflection->MutableMessage(message, field));
          modified = nestedMessageChanged || modified;
        }
      }
    }
  }
  return modified;
}